

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KeysetTest.h
# Opt level: O2

void SparseKeygenRecurse<Blob<2048>,Blob<224>>
               (pfHash hash,int start,int bitsleft,bool inclusive,Blob<2048> *k,
               vector<Blob<224>,_std::allocator<Blob<224>_>_> *hashes)

{
  Blob<224> h;
  Blob<224> local_4c;
  
  Blob<224>::Blob(&local_4c);
  while (start < 0x800) {
    flipbit(k,0x100,start);
    if (bitsleft == 1 || inclusive) {
      (*hash)(k,0x100,0,&local_4c);
      std::vector<Blob<224>,_std::allocator<Blob<224>_>_>::push_back(hashes,&local_4c);
    }
    if (1 < bitsleft) {
      SparseKeygenRecurse<Blob<2048>,Blob<224>>(hash,start + 1U,bitsleft + -1,inclusive,k,hashes);
    }
    flipbit(k,0x100,start);
    start = start + 1U;
  }
  return;
}

Assistant:

void SparseKeygenRecurse ( pfHash hash, int start, int bitsleft, bool inclusive, keytype & k, std::vector<hashtype> & hashes )
{
  const int nbytes = sizeof(keytype);
  const int nbits = nbytes * 8;

  hashtype h;

  for(int i = start; i < nbits; i++)
  {
    flipbit(&k, nbytes, i);

    if(inclusive || (bitsleft == 1))
    {
      hash(&k, sizeof(keytype), 0, &h);
      hashes.push_back(h);
    }

    if(bitsleft > 1)
    {
      SparseKeygenRecurse(hash, i+1, bitsleft-1, inclusive, k, hashes);
    }

    flipbit(&k, nbytes, i);
  }
}